

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_ast_node * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::parse_path_or_unary_expression(xpath_parser *this)

{
  xpath_lexer *this_00;
  lexeme_t lVar1;
  xpath_value_type xVar2;
  xpath_variable_set *this_01;
  char_t *pcVar3;
  size_t sVar4;
  bool bVar5;
  char cVar6;
  byte bVar7;
  nodetest_t nVar8;
  byte *pbVar9;
  xpath_ast_node *pxVar10;
  xpath_variable *__dest;
  char_t *pcVar11;
  ulong uVar12;
  xpath_parse_result *pxVar13;
  ulong uVar14;
  xpath_ast_node *pxVar15;
  xpath_ast_node *pxVar16;
  char *pcVar17;
  xpath_ast_node **ppxVar18;
  xpath_lexer_string *in_RSI;
  xpath_ast_node *unaff_R15;
  size_t __n;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  xpath_ast_node *args [2];
  xpath_lexer_string local_68;
  xpath_ast_node *local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  
  lVar1 = (this->_lexer)._cur_lexeme;
  if (lex_string < lVar1) {
LAB_00163990:
    pxVar15 = parse_location_path(this);
    return pxVar15;
  }
  this_00 = &this->_lexer;
  if ((0xd800U >> (lVar1 & (lex_double_dot|lex_plus)) & 1) == 0) {
    if (lVar1 == lex_minus) {
      xpath_lexer::next(this_00);
      pxVar15 = parse_expression(this,7);
      if (pxVar15 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar10 == (xpath_ast_node *)0x0) {
        return (xpath_ast_node *)0x0;
      }
      pxVar10->_type = '\x0e';
      pxVar10->_rettype = '\x02';
      pxVar10->_axis = '\0';
      pxVar10->_test = '\0';
      pxVar10->_left = pxVar15;
      pxVar10->_right = (xpath_ast_node *)0x0;
      pxVar10->_next = (xpath_ast_node *)0x0;
      return pxVar10;
    }
    if (lVar1 != lex_string) goto LAB_00163990;
    pbVar9 = (byte *)this_00->_cur;
    do {
      bVar7 = *pbVar9;
      pbVar9 = pbVar9 + 1;
    } while (((anonymous_namespace)::chartype_table[bVar7] & 8) != 0);
    if ((bVar7 == 0x28) &&
       (nVar8 = parse_node_test_type((xpath_parser *)&(this->_lexer)._cur_lexeme_contents,in_RSI),
       nVar8 == nodetest_none)) {
      bVar5 = true;
    }
    else {
      unaff_R15 = parse_location_path(this);
      bVar5 = false;
    }
    if (!bVar5) {
      return unaff_R15;
    }
  }
  switch((this->_lexer)._cur_lexeme) {
  case lex_var_ref:
    this_01 = this->_variables;
    if (this_01 != (xpath_variable_set *)0x0) {
      pcVar3 = (this->_lexer)._cur_lexeme_contents.begin;
      uVar14 = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar3;
      pcVar11 = this->_scratch;
      if ((uVar14 < 0x20) ||
         (pcVar11 = (char_t *)
                    (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                              allocate)(uVar14 + 1), pcVar11 != (char_t *)0x0)) {
        memcpy(pcVar11,pcVar3,uVar14);
        pcVar11[uVar14] = '\0';
        __dest = xpath_variable_set::_find(this_01,pcVar11);
        bVar5 = true;
        if (pcVar11 != this->_scratch) {
          (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                    (pcVar11);
        }
      }
      else {
        __dest = (xpath_variable *)0x0;
        bVar5 = false;
      }
      if (bVar5) {
        if (__dest == (xpath_variable *)0x0) {
          pxVar13 = this->_result;
          pcVar17 = "Unknown variable: variable set does not contain the given name";
          goto LAB_00164616;
        }
        xpath_lexer::next(this_00);
        xVar2 = __dest->_type;
        pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar10 != (xpath_ast_node *)0x0) {
          pxVar10->_type = '\x14';
          pxVar10->_rettype = (char)xVar2;
          pxVar10->_axis = '\0';
          pxVar10->_test = '\0';
          goto LAB_00163d5f;
        }
      }
      else {
        *this->_alloc->_error = true;
      }
      goto LAB_00164625;
    }
    pxVar13 = this->_result;
    pcVar17 = "Unknown variable: variable set is not provided";
    break;
  case lex_open_brace:
    xpath_lexer::next(this_00);
    pxVar10 = (xpath_ast_node *)0x0;
    pxVar15 = parse_expression(this,0);
    if (pxVar15 != (xpath_ast_node *)0x0) {
      if ((this->_lexer)._cur_lexeme != lex_close_brace) {
        pxVar13 = this->_result;
        pcVar17 = "Expected \')\' to match an opening \'(\'";
LAB_00164616:
        pxVar13->error = pcVar17;
        pxVar13->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
        goto LAB_00164625;
      }
      xpath_lexer::next(this_00);
      pxVar10 = pxVar15;
    }
    goto LAB_0016462d;
  default:
    pxVar13 = this->_result;
    pcVar17 = "Unrecognizable primary expression";
    break;
  case lex_quoted_string:
    pcVar3 = (this->_lexer)._cur_lexeme_contents.begin;
    if (pcVar3 == (char_t *)0x0) {
      __dest = (xpath_variable *)0x16ad89;
    }
    else {
      __n = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar3;
      __dest = (xpath_variable *)xpath_allocator::allocate(this->_alloc,__n + 1);
      if (__dest == (xpath_variable *)0x0) {
        __dest = (xpath_variable *)0x0;
      }
      else {
        memcpy(__dest,(this->_lexer)._cur_lexeme_contents.begin,__n);
        *(char *)((long)__dest + __n) = '\0';
      }
    }
    if (__dest != (xpath_variable *)0x0) {
      xpath_lexer::next(this_00);
      pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar10 != (xpath_ast_node *)0x0) {
        pxVar10->_type = '\x12';
        pxVar10->_rettype = '\x03';
        pxVar10->_axis = '\0';
        pxVar10->_test = '\0';
LAB_00163d5f:
        pxVar10->_left = (xpath_ast_node *)0x0;
        pxVar10->_right = (xpath_ast_node *)0x0;
        pxVar10->_next = (xpath_ast_node *)0x0;
        (pxVar10->_data).string = (char_t *)__dest;
        goto LAB_0016462d;
      }
    }
LAB_00164625:
    pxVar10 = (xpath_ast_node *)0x0;
    goto LAB_0016462d;
  case lex_number:
    pcVar3 = (this->_lexer)._cur_lexeme_contents.begin;
    uVar14 = (long)(this->_lexer)._cur_lexeme_contents.end - (long)pcVar3;
    pcVar11 = this->_scratch;
    if ((uVar14 < 0x20) ||
       (pcVar11 = (char_t *)
                  (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::
                            allocate)(uVar14 + 1), pcVar11 != (char_t *)0x0)) {
      memcpy(pcVar11,pcVar3,uVar14);
      pcVar11[uVar14] = '\0';
      local_48 = (xpath_ast_node *)convert_string_to_number(pcVar11);
      bVar5 = true;
      if (pcVar11 != this->_scratch) {
        (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::deallocate)
                  (pcVar11);
      }
    }
    else {
      local_48 = (xpath_ast_node *)0x0;
      bVar5 = false;
    }
    if (bVar5) {
      xpath_lexer::next(this_00);
      pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar10 != (xpath_ast_node *)0x0) {
        pxVar10->_type = '\x13';
        pxVar10->_rettype = '\x02';
        pxVar10->_axis = '\0';
        pxVar10->_test = '\0';
        pxVar10->_left = (xpath_ast_node *)0x0;
        pxVar10->_right = (xpath_ast_node *)0x0;
        pxVar10->_next = (xpath_ast_node *)0x0;
        (pxVar10->_data).number = (double)local_48;
        goto LAB_0016462d;
      }
    }
    else {
      *this->_alloc->_error = true;
    }
    goto LAB_00163c85;
  case lex_string:
    local_58[0] = (xpath_ast_node *)0x0;
    local_58[1] = (xpath_ast_node *)0x0;
    local_68.begin = (this->_lexer)._cur_lexeme_contents.begin;
    local_68.end = (this->_lexer)._cur_lexeme_contents.end;
    xpath_lexer::next(this_00);
    if ((this->_lexer)._cur_lexeme == lex_open_brace) {
      xpath_lexer::next(this_00);
      sVar4 = this->_depth;
      pxVar10 = (xpath_ast_node *)0x0;
      uVar14 = 0;
      pxVar15 = (xpath_ast_node *)0x0;
LAB_00163b2f:
      lVar1 = (this->_lexer)._cur_lexeme;
      if (lVar1 != lex_close_brace) {
        if (uVar14 != 0) {
          if (lVar1 != lex_comma) {
            pxVar13 = this->_result;
            pcVar17 = "No comma between function arguments";
            goto LAB_00164616;
          }
          xpath_lexer::next(this_00);
        }
        uVar12 = this->_depth + 1;
        this->_depth = uVar12;
        if (uVar12 < 0x401) goto code_r0x00163b6a;
        pxVar13 = this->_result;
        pcVar17 = "Exceeded maximum allowed query depth";
        goto LAB_00164616;
      }
      xpath_lexer::next(this_00);
      this->_depth = sVar4;
      switch(*local_68.begin) {
      case 'b':
        bVar5 = xpath_lexer_string::operator==(&local_68,"boolean");
        pxVar15 = local_58[0];
        if ((uVar14 != 1) || (!bVar5)) goto switchD_00163cbd_caseD_64;
        pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_00164625;
        pxVar10->_type = '-';
        pxVar10->_rettype = '\x04';
        pxVar10->_axis = '\0';
        pxVar10->_test = '\0';
        break;
      case 'c':
        bVar5 = xpath_lexer_string::operator==(&local_68,"count");
        pxVar15 = local_58[0];
        if ((uVar14 == 1) && (bVar5)) {
          if (local_58[0]->_rettype != '\x01') goto LAB_001647e7;
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_00163c85;
          pxVar10->_type = '\x17';
          pxVar10->_rettype = '\x02';
          pxVar10->_axis = '\0';
          pxVar10->_test = '\0';
          pxVar10->_left = pxVar15;
          pxVar10->_right = (xpath_ast_node *)0x0;
          pxVar10->_next = (xpath_ast_node *)0x0;
          goto LAB_0016462d;
        }
        bVar5 = xpath_lexer_string::operator==(&local_68,"contains");
        if ((uVar14 == 2) && (bVar5)) {
          local_48 = local_58[0];
          uStack_40 = local_58[1];
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_00164625;
          pxVar10->_type = '#';
          pxVar10->_rettype = '\x04';
          pxVar10->_axis = '\0';
          pxVar10->_test = '\0';
        }
        else {
          bVar5 = xpath_lexer_string::operator==(&local_68,"concat");
          if ((uVar14 < 2) || (!bVar5)) {
            bVar5 = xpath_lexer_string::operator==(&local_68,"ceiling");
            pxVar15 = local_58[0];
            if ((uVar14 != 1) || (!bVar5)) goto switchD_00163cbd_caseD_64;
            pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar10 != (xpath_ast_node *)0x0) {
              pxVar10->_type = '6';
              pxVar10->_rettype = '\x02';
              pxVar10->_axis = '\0';
              pxVar10->_test = '\0';
              break;
            }
            goto LAB_00164625;
          }
          local_48 = local_58[0];
          uStack_40 = local_58[1];
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_00164625;
          pxVar10->_type = '!';
          pxVar10->_rettype = '\x03';
          pxVar10->_axis = '\0';
          pxVar10->_test = '\0';
        }
LAB_0016455a:
        uVar19 = (undefined4)local_48;
        uVar20 = local_48._4_4_;
        uVar21 = (undefined4)uStack_40;
        uVar22 = uStack_40._4_4_;
LAB_0016455f:
        *(undefined4 *)&pxVar10->_left = uVar19;
        *(undefined4 *)((long)&pxVar10->_left + 4) = uVar20;
        *(undefined4 *)&pxVar10->_right = uVar21;
        *(undefined4 *)((long)&pxVar10->_right + 4) = uVar22;
        pxVar10->_next = (xpath_ast_node *)0x0;
        goto LAB_0016462d;
      default:
        goto switchD_00163cbd_caseD_64;
      case 'f':
        bVar5 = xpath_lexer_string::operator==(&local_68,"false");
        if ((uVar14 == 0) && (bVar5)) {
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 != (xpath_ast_node *)0x0) {
            pxVar10->_type = '0';
            pxVar10->_rettype = '\x04';
            pxVar10->_axis = '\0';
            pxVar10->_test = '\0';
LAB_00164201:
            uVar19 = 0;
            uVar20 = 0;
            uVar21 = 0;
            uVar22 = 0;
            goto LAB_0016455f;
          }
          goto LAB_00164625;
        }
        bVar5 = xpath_lexer_string::operator==(&local_68,"floor");
        pxVar15 = local_58[0];
        if ((uVar14 != 1) || (!bVar5)) goto switchD_00163cbd_caseD_64;
        pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_00164625;
        pxVar10->_type = '5';
        pxVar10->_rettype = '\x02';
        pxVar10->_axis = '\0';
        pxVar10->_test = '\0';
        break;
      case 'i':
        bVar5 = xpath_lexer_string::operator==(&local_68,"id");
        pxVar15 = local_58[0];
        if ((uVar14 != 1) || (!bVar5)) goto switchD_00163cbd_caseD_64;
        pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_00164625;
        pxVar10->_type = '\x18';
        pxVar10->_rettype = '\x01';
        pxVar10->_axis = '\0';
        pxVar10->_test = '\0';
        break;
      case 'l':
        bVar5 = xpath_lexer_string::operator==(&local_68,"last");
        if ((uVar14 == 0) && (bVar5)) {
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 != (xpath_ast_node *)0x0) {
            pxVar10->_type = '\x15';
            pxVar10->_rettype = '\x02';
            pxVar10->_axis = '\0';
            pxVar10->_test = '\0';
            goto LAB_00164201;
          }
          goto LAB_00164625;
        }
        bVar5 = xpath_lexer_string::operator==(&local_68,"lang");
        pxVar15 = local_58[0];
        if ((uVar14 != 1) || (!bVar5)) {
          bVar5 = xpath_lexer_string::operator==(&local_68,"local-name");
          pxVar15 = local_58[0];
          if ((1 < uVar14) || (!bVar5)) goto switchD_00163cbd_caseD_64;
          if ((uVar14 == 1) && (local_58[0]->_rettype != '\x01')) goto LAB_001647e7;
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 != (xpath_ast_node *)0x0) {
            cVar6 = '\x1a';
            goto LAB_00164370;
          }
          goto LAB_00164625;
        }
        pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_00164625;
        pxVar10->_type = '1';
        pxVar10->_rettype = '\x04';
        pxVar10->_axis = '\0';
        pxVar10->_test = '\0';
        break;
      case 'n':
        bVar5 = xpath_lexer_string::operator==(&local_68,"name");
        pxVar15 = local_58[0];
        if ((uVar14 < 2) && (bVar5)) {
          if ((uVar14 != 1) || (local_58[0]->_rettype == '\x01')) {
            pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar10 != (xpath_ast_node *)0x0) {
              cVar6 = '\x1e';
              goto LAB_00164370;
            }
            goto LAB_00164625;
          }
        }
        else {
          bVar5 = xpath_lexer_string::operator==(&local_68,"namespace-uri");
          pxVar15 = local_58[0];
          if ((1 < uVar14) || (!bVar5)) {
            bVar5 = xpath_lexer_string::operator==(&local_68,"normalize-space");
            if ((uVar14 < 2) && (bVar5)) {
              local_48 = local_58[0];
              uStack_40 = local_58[1];
              pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
              if (pxVar10 != (xpath_ast_node *)0x0) {
                bVar7 = uVar14 == 0 ^ 0x2b;
LAB_001642af:
                pxVar10->_type = bVar7;
                pxVar10->_rettype = '\x03';
                pxVar10->_axis = '\0';
                pxVar10->_test = '\0';
                goto LAB_0016455a;
              }
            }
            else {
              bVar5 = xpath_lexer_string::operator==(&local_68,"not");
              pxVar15 = local_58[0];
              if ((uVar14 == 1) && (bVar5)) {
                pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                if (pxVar10 != (xpath_ast_node *)0x0) {
                  pxVar10->_type = '.';
                  pxVar10->_rettype = '\x04';
                  pxVar10->_axis = '\0';
                  pxVar10->_test = '\0';
                  break;
                }
              }
              else {
                bVar5 = xpath_lexer_string::operator==(&local_68,"number");
                pxVar15 = local_58[0];
                if ((1 < uVar14) || (!bVar5)) goto switchD_00163cbd_caseD_64;
                pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                if (pxVar10 != (xpath_ast_node *)0x0) {
                  bVar7 = uVar14 == 0 ^ 0x33;
                  goto LAB_00164252;
                }
              }
            }
            goto LAB_00164625;
          }
          if ((uVar14 != 1) || (local_58[0]->_rettype == '\x01')) {
            pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
            if (pxVar10 != (xpath_ast_node *)0x0) {
              cVar6 = '\x1c';
              goto LAB_00164370;
            }
            goto LAB_00164625;
          }
        }
LAB_001647e7:
        pxVar13 = this->_result;
        pcVar17 = "Function has to be applied to node set";
        goto LAB_00164616;
      case 'p':
        bVar5 = xpath_lexer_string::operator==(&local_68,"position");
        if ((uVar14 != 0) || (!bVar5)) goto switchD_00163cbd_caseD_64;
        pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar10 != (xpath_ast_node *)0x0) {
          pxVar10->_type = '\x16';
          pxVar10->_rettype = '\x02';
          pxVar10->_axis = '\0';
          pxVar10->_test = '\0';
          goto LAB_00164201;
        }
        goto LAB_00164625;
      case 'r':
        bVar5 = xpath_lexer_string::operator==(&local_68,"round");
        pxVar15 = local_58[0];
        if ((uVar14 != 1) || (!bVar5)) goto switchD_00163cbd_caseD_64;
        pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_00164625;
        pxVar10->_type = '7';
        pxVar10->_rettype = '\x02';
        pxVar10->_axis = '\0';
        pxVar10->_test = '\0';
        break;
      case 's':
        bVar5 = xpath_lexer_string::operator==(&local_68,"string");
        pxVar15 = local_58[0];
        if ((uVar14 < 2) && (bVar5)) {
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_00164625;
          cVar6 = ' ';
LAB_00164370:
          pxVar10->_type = cVar6 - (uVar14 == 0);
          pxVar10->_rettype = '\x03';
          pxVar10->_axis = '\0';
        }
        else {
          bVar5 = xpath_lexer_string::operator==(&local_68,"string-length");
          pxVar15 = local_58[0];
          if ((1 < uVar14) || (!bVar5)) {
            bVar5 = xpath_lexer_string::operator==(&local_68,"starts-with");
            if ((uVar14 == 2) && (bVar5)) {
              local_48 = local_58[0];
              uStack_40 = local_58[1];
              pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
              if (pxVar10 != (xpath_ast_node *)0x0) {
                pxVar10->_type = '\"';
                pxVar10->_rettype = '\x04';
                pxVar10->_axis = '\0';
                pxVar10->_test = '\0';
                goto LAB_0016455a;
              }
              goto LAB_00164625;
            }
            bVar5 = xpath_lexer_string::operator==(&local_68,"substring-before");
            if ((uVar14 == 2) && (bVar5)) {
              local_48 = local_58[0];
              uStack_40 = local_58[1];
              pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
              if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_00164625;
              pxVar10->_type = '$';
              pxVar10->_rettype = '\x03';
              pxVar10->_axis = '\0';
              pxVar10->_test = '\0';
            }
            else {
              bVar5 = xpath_lexer_string::operator==(&local_68,"substring-after");
              if ((uVar14 != 2) || (!bVar5)) {
                bVar5 = xpath_lexer_string::operator==(&local_68,"substring");
                if (((uVar14 & 0xfffffffffffffffe) == 2) && (bVar5)) {
                  local_48 = local_58[0];
                  uStack_40 = local_58[1];
                  pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                  if (pxVar10 != (xpath_ast_node *)0x0) {
                    bVar7 = uVar14 == 2 ^ 0x27;
                    goto LAB_001642af;
                  }
                }
                else {
                  bVar5 = xpath_lexer_string::operator==(&local_68,"sum");
                  pxVar15 = local_58[0];
                  if ((uVar14 != 1) || (!bVar5)) goto switchD_00163cbd_caseD_64;
                  if (local_58[0]->_rettype != '\x01') goto LAB_001647e7;
                  pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
                  if (pxVar10 != (xpath_ast_node *)0x0) {
                    pxVar10->_type = '4';
                    pxVar10->_rettype = '\x02';
                    pxVar10->_axis = '\0';
                    pxVar10->_test = '\0';
                    break;
                  }
                }
                goto LAB_00164625;
              }
              local_48 = local_58[0];
              uStack_40 = local_58[1];
              pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
              if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_00164625;
              pxVar10->_type = '%';
              pxVar10->_rettype = '\x03';
              pxVar10->_axis = '\0';
              pxVar10->_test = '\0';
            }
            goto LAB_0016455a;
          }
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 == (xpath_ast_node *)0x0) goto LAB_00164625;
          bVar7 = uVar14 == 0 ^ 0x29;
LAB_00164252:
          pxVar10->_type = bVar7;
          pxVar10->_rettype = '\x02';
          pxVar10->_axis = '\0';
        }
        pxVar10->_test = '\0';
        break;
      case 't':
        bVar5 = xpath_lexer_string::operator==(&local_68,"translate");
        if ((uVar14 == 3) && (bVar5)) {
          local_48 = local_58[0];
          uStack_40 = local_58[1];
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 != (xpath_ast_node *)0x0) {
            pxVar10->_type = ',';
            pxVar10->_rettype = '\x03';
            pxVar10->_axis = '\0';
            pxVar10->_test = '\0';
            goto LAB_0016455a;
          }
          goto LAB_00164625;
        }
        bVar5 = xpath_lexer_string::operator==(&local_68,"true");
        if ((uVar14 == 0) && (bVar5)) {
          pxVar10 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
          if (pxVar10 != (xpath_ast_node *)0x0) {
            pxVar10->_type = '/';
            pxVar10->_rettype = '\x04';
            pxVar10->_axis = '\0';
            pxVar10->_test = '\0';
            goto LAB_00164201;
          }
          goto LAB_00164625;
        }
switchD_00163cbd_caseD_64:
        pxVar13 = this->_result;
        pcVar17 = "Unrecognized function or wrong parameter count";
        goto LAB_00164616;
      }
      pxVar10->_left = pxVar15;
      pxVar10->_right = (xpath_ast_node *)0x0;
      pxVar10->_next = (xpath_ast_node *)0x0;
      goto LAB_0016462d;
    }
    pxVar13 = this->_result;
    pcVar17 = "Unrecognized function call";
  }
  pxVar13->error = pcVar17;
  pxVar13->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
LAB_00163c85:
  pxVar10 = (xpath_ast_node *)0x0;
LAB_0016462d:
  if (pxVar10 != (xpath_ast_node *)0x0) {
    sVar4 = this->_depth;
    do {
      if ((this->_lexer)._cur_lexeme != lex_open_square_brace) {
        this->_depth = sVar4;
        goto LAB_00164737;
      }
      xpath_lexer::next(this_00);
      uVar14 = this->_depth + 1;
      this->_depth = uVar14;
      if (0x400 < uVar14) {
        pxVar13 = this->_result;
        pcVar17 = "Exceeded maximum allowed query depth";
LAB_00164725:
        pxVar13->error = pcVar17;
        pxVar13->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
        break;
      }
      if (pxVar10->_rettype != '\x01') {
        pxVar13 = this->_result;
        pcVar17 = "Predicate has to be applied to node set";
        goto LAB_00164725;
      }
      bVar5 = false;
      pxVar15 = parse_expression(this,0);
      if (pxVar15 != (xpath_ast_node *)0x0) {
        pxVar16 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
        if (pxVar16 == (xpath_ast_node *)0x0) {
          pxVar10 = (xpath_ast_node *)0x0;
        }
        else {
          pxVar16->_type = '\x11';
          pxVar16->_rettype = '\x01';
          pxVar16->_axis = '\0';
          pxVar16->_test = '\0';
          pxVar16->_left = pxVar10;
          pxVar16->_right = pxVar15;
          pxVar16->_next = (xpath_ast_node *)0x0;
          pxVar10 = pxVar16;
        }
        if (pxVar10 == (xpath_ast_node *)0x0) {
          bVar5 = false;
          pxVar10 = (xpath_ast_node *)0x0;
        }
        else if ((this->_lexer)._cur_lexeme == lex_close_square_brace) {
          xpath_lexer::next(this_00);
          bVar5 = true;
        }
        else {
          pxVar13 = this->_result;
          pxVar13->error = "Expected \']\' to match an opening \'[\'";
          pxVar13->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
          bVar5 = false;
        }
      }
    } while (bVar5);
  }
  pxVar10 = (xpath_ast_node *)0x0;
LAB_00164737:
  if (pxVar10 != (xpath_ast_node *)0x0) {
    lVar1 = (this->_lexer)._cur_lexeme;
    if ((lVar1 & ~lex_equal) != lex_slash) {
      return pxVar10;
    }
    xpath_lexer::next(this_00);
    pxVar15 = pxVar10;
    if (lVar1 != lex_double_slash) {
LAB_001647b9:
      pxVar15 = parse_relative_location_path(this,pxVar15);
      return pxVar15;
    }
    if (pxVar10->_rettype == '\x01') {
      pxVar15 = (xpath_ast_node *)xpath_allocator::allocate(this->_alloc,0x28);
      if (pxVar15 == (xpath_ast_node *)0x0) {
        pxVar15 = (xpath_ast_node *)0x0;
      }
      else {
        pxVar15->_type = '8';
        pxVar15->_rettype = '\x01';
        pxVar15->_axis = '\x05';
        pxVar15->_test = '\x02';
        pxVar15->_left = pxVar10;
        pxVar15->_right = (xpath_ast_node *)0x0;
        pxVar15->_next = (xpath_ast_node *)0x0;
        (pxVar15->_data).string = (char_t *)0x0;
      }
      if (pxVar15 != (xpath_ast_node *)0x0) goto LAB_001647b9;
    }
    else {
      pxVar13 = this->_result;
      pxVar13->error = "Step has to be applied to node set";
      pxVar13->offset = (long)(this->_lexer)._cur_lexeme_pos - (long)this->_query;
    }
  }
  return (xpath_ast_node *)0x0;
code_r0x00163b6a:
  pxVar16 = parse_expression(this,0);
  if (pxVar16 != (xpath_ast_node *)0x0) {
    ppxVar18 = local_58 + uVar14;
    if (1 < uVar14) {
      ppxVar18 = &pxVar15->_next;
    }
    *ppxVar18 = pxVar16;
    uVar14 = uVar14 + 1;
    pxVar15 = pxVar16;
  }
  if (pxVar16 == (xpath_ast_node *)0x0) goto LAB_0016462d;
  goto LAB_00163b2f;
}

Assistant:

xpath_ast_node* parse_path_or_unary_expression()
		{
			// Clarification.
			// PathExpr begins with either LocationPath or FilterExpr.
			// FilterExpr begins with PrimaryExpr
			// PrimaryExpr begins with '$' in case of it being a variable reference,
			// '(' in case of it being an expression, string literal, number constant or
			// function call.
			if (_lexer.current() == lex_var_ref || _lexer.current() == lex_open_brace ||
				_lexer.current() == lex_quoted_string || _lexer.current() == lex_number ||
				_lexer.current() == lex_string)
			{
				if (_lexer.current() == lex_string)
				{
					// This is either a function call, or not - if not, we shall proceed with location path
					const char_t* state = _lexer.state();

					while (PUGI_IMPL_IS_CHARTYPE(*state, ct_space)) ++state;

					if (*state != '(')
						return parse_location_path();

					// This looks like a function call; however this still can be a node-test. Check it.
					if (parse_node_test_type(_lexer.contents()) != nodetest_none)
						return parse_location_path();
				}

				xpath_ast_node* n = parse_filter_expression();
				if (!n) return NULL;

				if (_lexer.current() == lex_slash || _lexer.current() == lex_double_slash)
				{
					lexeme_t l = _lexer.current();
					_lexer.next();

					if (l == lex_double_slash)
					{
						if (n->rettype() != xpath_type_node_set)
							return error("Step has to be applied to node set");

						n = alloc_node(ast_step, n, axis_descendant_or_self, nodetest_type_node, NULL);
						if (!n) return NULL;
					}

					// select from location path
					return parse_relative_location_path(n);
				}

				return n;
			}
			else if (_lexer.current() == lex_minus)
			{
				_lexer.next();

				// precedence 7+ - only parses union expressions
				xpath_ast_node* n = parse_expression(7);
				if (!n) return NULL;

				return alloc_node(ast_op_negate, xpath_type_number, n);
			}
			else
			{
				return parse_location_path();
			}
		}